

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void __thiscall
dg::vr::RelationsAnalyzer::inferShiftInLoop
          (RelationsAnalyzer *this,
          vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
          Handle placeholder)

{
  Shift s;
  HandlePtr pBVar1;
  VectorSet<const_llvm::Value_*> *pVVar2;
  Type TVar3;
  RelationsAnalyzer *toRels;
  
  toRels = (RelationsAnalyzer *)
           &(*(changeLocations->
              super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
              )._M_impl.super__Vector_impl_data._M_start)->relations;
  pBVar1 = getCorrespondingByContent((ValueRelations *)toRels,froms);
  pVVar2 = ValueRelations::getEqual
                     ((ValueRelations *)toRels,
                      ((pBVar1->relatedBuckets)._M_elems[10].vec.
                       super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_data);
  if ((pVVar2->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pVVar2->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    s = getShift(toRels,changeLocations,froms);
    if (s != UNKNOWN) {
      if (s < EQ) {
        inferFromNonEquality
                  (this,*(VRLocation **)
                         (**(long **)&((*(changeLocations->
                                         super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->successors).
                                      super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8),froms,s,placeholder);
      }
      TVar3 = (uint)(s != INC) * 4 + SLE;
      if (s == EQ) {
        TVar3 = EQ;
      }
      TVar3 = dg::vr::Relations::inverted(TVar3);
      ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
                (newGraph,placeholder,TVar3,
                 (pVVar2->vec).
                 super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      return;
    }
  }
  return;
}

Assistant:

void RelationsAnalyzer::inferShiftInLoop(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    const ValueRelations &predGraph = changeLocations[0]->relations;
    HandlePtr from = getCorrespondingByContent(predGraph, froms);
    assert(from);

    const auto &initial = predGraph.getEqual(predGraph.getPointedTo(*from));
    if (initial.empty())
        return;

    auto shift = getShift(changeLocations, froms);
    if (shift == Shift::UNKNOWN)
        return;

    if (shift == Shift::INC || shift == Shift::DEC)
        inferFromNonEquality(*changeLocations[0]->getSuccLocation(0), froms,
                             shift, placeholder);

    Relations::Type rel =
            shift == Shift::EQ
                    ? Relations::EQ
                    : (shift == Shift::INC ? Relations::SLE : Relations::SGE);

    // placeholder must be first so that if setting EQ, its bucket is
    // preserved
    newGraph.set(placeholder, Relations::inverted(rel), *initial.begin());
}